

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O0

bool kratos::fs::exists(string *filename)

{
  byte bVar1;
  undefined1 local_218 [8];
  ifstream in;
  string *filename_local;
  
  std::ifstream::ifstream(local_218,(string *)filename,_S_in);
  bVar1 = std::ios::good();
  std::ifstream::~ifstream(local_218);
  return (bool)(bVar1 & 1);
}

Assistant:

bool exists(const std::string &filename) {
#if defined(INCLUDE_FILESYSTEM)
    namespace fs = std::filesystem;
    return fs::exists(filename);
#else
    std::ifstream in(filename);
    return in.good();
#endif
}